

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL> *
__thiscall
spirv_cross::
SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>::
operator=(SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          *this,SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                *other)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  undefined8 *puVar5;
  void *pvVar6;
  undefined8 uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  
  clear(this);
  if ((other->
      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).ptr == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &other->stack_storage) {
    reserve(this,(other->
                 super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).buffer_size);
    uVar8 = (other->
            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).buffer_size;
    if (uVar8 != 0) {
      lVar10 = 0x10;
      uVar9 = 0;
      do {
        pbVar3 = (this->
                 super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).ptr;
        puVar1 = (undefined8 *)((long)&(pbVar3->_M_dataplus)._M_p + lVar10);
        pbVar4 = (other->
                 super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).ptr;
        puVar2 = (undefined8 *)((long)&(pbVar4->_M_dataplus)._M_p + lVar10);
        *(undefined8 **)((long)pbVar3 + lVar10 + -0x10) = puVar1;
        puVar5 = *(undefined8 **)((long)pbVar4 + lVar10 + -0x10);
        if (puVar2 == puVar5) {
          uVar7 = puVar2[1];
          *puVar1 = *puVar2;
          puVar1[1] = uVar7;
        }
        else {
          *(undefined8 **)((long)pbVar3 + lVar10 + -0x10) = puVar5;
          *(undefined8 *)((long)&(pbVar3->_M_dataplus)._M_p + lVar10) = *puVar2;
        }
        *(undefined8 *)((long)pbVar3 + lVar10 + -8) = *(undefined8 *)((long)pbVar4 + lVar10 + -8);
        *(undefined8 **)((long)pbVar4 + lVar10 + -0x10) = puVar2;
        *(undefined8 *)((long)pbVar4 + lVar10 + -8) = 0;
        *(undefined1 *)((long)&(pbVar4->_M_dataplus)._M_p + lVar10) = 0;
        pbVar3 = (other->
                 super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).ptr;
        pvVar6 = *(void **)((long)pbVar3 + lVar10 + -0x10);
        if ((void *)((long)&(pbVar3->_M_dataplus)._M_p + lVar10) != pvVar6) {
          operator_delete(pvVar6);
        }
        uVar9 = uVar9 + 1;
        uVar8 = (other->
                super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).buffer_size;
        lVar10 = lVar10 + 0x20;
      } while (uVar9 < uVar8);
    }
    (this->
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).buffer_size = uVar8;
    (other->
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).buffer_size = 0;
  }
  else {
    pbVar3 = (this->
             super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).ptr;
    if (pbVar3 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &this->stack_storage) {
      free(pbVar3);
    }
    (this->
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).ptr = (other->
            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).ptr;
    (this->
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).buffer_size =
         (other->
         super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ).buffer_size;
    this->buffer_capacity = other->buffer_capacity;
    (other->
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    (other->
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).buffer_size = 0;
    other->buffer_capacity = 0;
  }
  return this;
}

Assistant:

SmallVector &operator=(SmallVector &&other) SPIRV_CROSS_NOEXCEPT
	{
		clear();
		if (other.ptr != other.stack_storage.data())
		{
			// Pilfer allocated pointer.
			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = other.ptr;
			this->buffer_size = other.buffer_size;
			buffer_capacity = other.buffer_capacity;
			other.ptr = nullptr;
			other.buffer_size = 0;
			other.buffer_capacity = 0;
		}
		else
		{
			// Need to move the stack contents individually.
			reserve(other.buffer_size);
			for (size_t i = 0; i < other.buffer_size; i++)
			{
				new (&this->ptr[i]) T(std::move(other.ptr[i]));
				other.ptr[i].~T();
			}
			this->buffer_size = other.buffer_size;
			other.buffer_size = 0;
		}
		return *this;
	}